

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLubyte *pGVar2;
  uint32_t *__ptr;
  nk_context *pnVar3;
  nk_font_atlas *atlas;
  nk_glfw glfw;
  nk_context *ctx;
  GLContext *updateInfo;
  int status;
  GLFWwindow *in_stack_ffffffffffffb848;
  int in_stack_ffffffffffffb850;
  SoundType in_stack_ffffffffffffb854;
  undefined1 local_47a8 [8];
  nk_glfw *in_stack_ffffffffffffb860;
  nk_glfw_init_state in_stack_ffffffffffffb874;
  GLFWwindow *in_stack_ffffffffffffb878;
  nk_glfw *in_stack_ffffffffffffb880;
  GLContext *in_stack_ffffffffffffb8a0;
  GLFWwindow *in_stack_ffffffffffffbc10;
  GLFWmonitor *in_stack_ffffffffffffbc18;
  char *in_stack_ffffffffffffbc20;
  int in_stack_ffffffffffffbc28;
  int in_stack_ffffffffffffbc2c;
  int local_4;
  
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    local_4 = -1;
  }
  else {
    glfwWindowHint(in_stack_ffffffffffffb854,in_stack_ffffffffffffb850);
    window = glfwCreateWindow(in_stack_ffffffffffffbc2c,in_stack_ffffffffffffbc28,
                              in_stack_ffffffffffffbc20,in_stack_ffffffffffffbc18,
                              in_stack_ffffffffffffbc10);
    if (window == (GLFWwindow *)0x0) {
      glfwTerminate();
      local_4 = -1;
    }
    else {
      glfwMakeContextCurrent
                ((GLFWwindow *)CONCAT44(in_stack_ffffffffffffb854,in_stack_ffffffffffffb850));
      iVar1 = gladLoadGLLoader((GLADloadproc)in_stack_ffffffffffffb848);
      glfwSwapInterval(in_stack_ffffffffffffb854);
      if (iVar1 == 0) {
        printf("Failed to initialize glad!");
        local_4 = -1;
      }
      else {
        pGVar2 = (*glad_glGetString)(0x1f00);
        printf("Vendor: %s\n",pGVar2);
        pGVar2 = (*glad_glGetString)(0x1f01);
        printf("Renderer: %s\n",pGVar2);
        (*glad_glGetString)(0x1f02);
        printf("Version: %s\n");
        iVar1 = glfwWindowShouldClose(in_stack_ffffffffffffb848);
        if (iVar1 == 0) {
          InitSound();
          InitBuffers();
          InitShaders();
          InitGame();
          InitEventHandlers();
          __ptr = (uint32_t *)malloc(0x30);
          *(GLFWwindow **)(__ptr + 4) = window;
          *__ptr = vertexArrayId;
          __ptr[1] = indexBufferId;
          __ptr[2] = basicShaderId;
          *(Gamefield **)(__ptr + 6) = gamefield;
          AudioManagerPlaySoundOnce(in_stack_ffffffffffffb854);
          memset(local_47a8,0,0x4780);
          pnVar3 = nk_glfw3_init(in_stack_ffffffffffffb880,in_stack_ffffffffffffb878,
                                 in_stack_ffffffffffffb874);
          *(nk_context **)(__ptr + 8) = pnVar3;
          *(undefined1 **)(__ptr + 10) = local_47a8;
          nk_glfw3_font_stash_begin
                    ((nk_glfw *)CONCAT44(in_stack_ffffffffffffb854,in_stack_ffffffffffffb850),
                     (nk_font_atlas **)in_stack_ffffffffffffb848);
          nk_glfw3_font_stash_end(in_stack_ffffffffffffb860);
          glfwSetWindowUserPointer
                    ((GLFWwindow *)CONCAT44(in_stack_ffffffffffffb854,in_stack_ffffffffffffb850),
                     in_stack_ffffffffffffb848);
          while( true ) {
            iVar1 = glfwWindowShouldClose(in_stack_ffffffffffffb848);
            if (iVar1 != 0) break;
            OnUpdate(in_stack_ffffffffffffb8a0);
          }
          nk_glfw3_shutdown((nk_glfw *)0x1477e0);
          free(__ptr);
          glfwTerminate();
          local_4 = 0;
        }
        else {
          fprintf(_stderr,"Unexpected window close!\n");
          local_4 = -1;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
    if (!glfwInit())
        return -1;

    glfwWindowHint(GLFW_RESIZABLE, GL_FALSE);
    window = glfwCreateWindow(WIDTH, HEIGHT, "Falling sand", NULL, NULL);

    if (!window) {
        glfwTerminate();
        return -1;
    }

    glfwMakeContextCurrent(window);
    int status = gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    if (!status) {
        printf("Failed to initialize glad!");
        return -1;
    }

    printf("Vendor: %s\n", glGetString(GL_VENDOR));
    printf("Renderer: %s\n", glGetString(GL_RENDERER));
    printf("Version: %s\n", glGetString(GL_VERSION));

    if (glfwWindowShouldClose(window)) {
        fprintf(stderr, "Unexpected window close!\n");
        return -1;
    }

    // Initializes all buffers and debug functions
    InitSound();
    InitBuffers();
    InitShaders();
//    InitDebug();
    InitGame();
    InitEventHandlers();

    struct GLContext* updateInfo = malloc(sizeof(struct GLContext));
    updateInfo->window = window;
    updateInfo->vertexArrayId = vertexArrayId;
    updateInfo->indexBufferId = indexBufferId;
    updateInfo->basicShaderId = basicShaderId;
    updateInfo->gamefield = gamefield;

    AudioManagerPlaySoundOnce(Ambient);

    struct nk_context* ctx;
    struct nk_glfw glfw = {0};
    ctx = nk_glfw3_init(&glfw, window, NK_GLFW3_DEFAULT);
    updateInfo->guiContext = ctx;
    updateInfo->glfw = &glfw;

    {
        struct nk_font_atlas* atlas;
        nk_glfw3_font_stash_begin(&glfw, &atlas);
        nk_glfw3_font_stash_end(&glfw);
    }

    glfwSetWindowUserPointer(window, updateInfo);

    while (!glfwWindowShouldClose(window)) {
        OnUpdate(updateInfo);
    }

    nk_glfw3_shutdown(&glfw);
    free(updateInfo);
    glfwTerminate();
    return 0;
}